

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiMenuColumns::Update(ImGuiMenuColumns *this,int count,float spacing,bool clear)

{
  ulong uVar1;
  undefined3 in_register_00000011;
  float fVar2;
  
  this->Count = count;
  this->Width = 0.0;
  this->NextWidth = 0.0;
  this->Spacing = spacing;
  if (CONCAT31(in_register_00000011,clear) != 0) {
    this->NextWidths[0] = 0.0;
    this->NextWidths[1] = 0.0;
    this->NextWidths[2] = 0.0;
    this->NextWidths[3] = 0.0;
  }
  if (0 < count) {
    fVar2 = this->Width;
    uVar1 = 0;
    do {
      if ((uVar1 != 0) && (0.0 < this->NextWidths[uVar1])) {
        fVar2 = fVar2 + spacing;
      }
      this->Pos[uVar1] = (float)(int)fVar2;
      fVar2 = fVar2 + this->NextWidths[uVar1];
      this->NextWidths[uVar1] = 0.0;
      uVar1 = uVar1 + 1;
    } while ((uint)count != uVar1);
    this->Width = fVar2;
  }
  return;
}

Assistant:

void ImGuiMenuColumns::Update(int count, float spacing, bool clear)
{
    IM_ASSERT(Count <= IM_ARRAYSIZE(Pos));
    Count = count;
    Width = NextWidth = 0.0f;
    Spacing = spacing;
    if (clear) memset(NextWidths, 0, sizeof(NextWidths));
    for (int i = 0; i < Count; i++)
    {
        if (i > 0 && NextWidths[i] > 0.0f)
            Width += Spacing;
        Pos[i] = (float)(int)Width;
        Width += NextWidths[i];
        NextWidths[i] = 0.0f;
    }
}